

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O3

int fillword(int f,int n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  line *plVar5;
  mgwin *pmVar6;
  int iVar7;
  ulong uVar8;
  
  pmVar6 = curwp;
  do {
    uVar8 = 0;
    if (-1 < fillcol) {
      iVar3 = 0;
      iVar7 = fillcol;
      do {
        if (uVar8 == (uint)pmVar6->w_doto) {
          iVar3 = selfinsert(f,n);
          return iVar3;
        }
        uVar4 = (ulong)(byte)pmVar6->w_dotp->l_text[uVar8];
        if (uVar4 == 9) {
          iVar2 = ntabstop(iVar3,pmVar6->w_bufp->b_tabw);
          pmVar6 = curwp;
          iVar7 = fillcol;
        }
        else {
          iVar2 = iVar3 + (uint)(((byte)cinfo[uVar4] >> 3 & 1) != 0);
        }
        uVar8 = uVar8 + 1;
        iVar3 = iVar2 + 1;
      } while (iVar2 < iVar7);
    }
    iVar3 = (int)uVar8;
    plVar5 = pmVar6->w_dotp;
    iVar7 = 0;
    if (pmVar6->w_doto != plVar5->l_used) {
      selfinsert(f,n);
      plVar5 = curwp->w_dotp;
      iVar7 = plVar5->l_used - curwp->w_doto;
      pmVar6 = curwp;
    }
    pmVar6->w_doto = iVar3;
    if ((plVar5->l_text[uVar8 & 0xffffffff] != '\t') && (plVar5->l_text[uVar8 & 0xffffffff] != ' '))
    {
      while( true ) {
        backchar(8,1);
        iVar3 = curwp->w_doto;
        cVar1 = curwp->w_dotp->l_text[iVar3];
        if (cVar1 == '\t') break;
        if ((cVar1 == ' ') || (iVar3 < 1)) break;
      }
    }
    if (iVar3 == 0) {
      do {
        forwchar(8,1);
        cVar1 = curwp->w_dotp->l_text[curwp->w_doto];
        if ((cVar1 == '\t') || (cVar1 == ' ')) break;
      } while (curwp->w_doto < curwp->w_dotp->l_used);
    }
    delwhite(8,1);
    lnewline();
    pmVar6 = curwp;
    iVar2 = curwp->w_dotp->l_used - iVar7;
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    curwp->w_doto = iVar3;
    pmVar6->w_rflag = pmVar6->w_rflag | 2;
    if ((iVar7 != 0) || (iVar2 < 1)) {
      return 1;
    }
  } while( true );
}

Assistant:

int
fillword(int f, int n)
{
	char	c;
	int	col, i, nce;

	for (i = col = 0; col <= fillcol; ++i, ++col) {
		if (i == curwp->w_doto)
			return selfinsert(f, n);
		c = lgetc(curwp->w_dotp, i);
		if (c == '\t')
			col = ntabstop(col, curwp->w_bufp->b_tabw);
		else if (ISCTRL(c) != FALSE)
			++col;
	}
	if (curwp->w_doto != llength(curwp->w_dotp)) {
		(void)selfinsert(f, n);
		nce = llength(curwp->w_dotp) - curwp->w_doto;
	} else
		nce = 0;
	curwp->w_doto = i;

	if ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' && c != '\t')
		do {
			(void)backchar(FFRAND, 1);
		} while ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' &&
		    c != '\t' && curwp->w_doto > 0);

	if (curwp->w_doto == 0)
		do {
			(void)forwchar(FFRAND, 1);
		} while ((c = lgetc(curwp->w_dotp, curwp->w_doto)) != ' ' &&
		    c != '\t' && curwp->w_doto < llength(curwp->w_dotp));

	(void)delwhite(FFRAND, 1);
	(void)lnewline();
	i = llength(curwp->w_dotp) - nce;
	curwp->w_doto = i > 0 ? i : 0;
	curwp->w_rflag |= WFMOVE;
	if (nce == 0 && curwp->w_doto != 0)
		return (fillword(f, n));
	return (TRUE);
}